

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::Expression::bindLookupResult
          (Expression *this,Compilation *comp,LookupResult *result,SourceRange sourceRange,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  MemberSelector *selector;
  SourceLocation SVar1;
  AssertionInstanceExpression *pAVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  SourceRange range;
  bool bVar8;
  ExpressionKind EVar9;
  Type *pTVar10;
  Symbol *pSVar11;
  Diagnostic *pDVar12;
  Type *pTVar13;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *ppEVar14;
  InvalidExpression *pIVar15;
  ulong uVar16;
  AssertionInstanceExpression *this_00;
  Compilation *comp_00;
  SourceLocation SVar17;
  InvocationExpressionSyntax *parentContext;
  SourceLocation invocation_00;
  long lVar18;
  SourceRange range_00;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors;
  SourceRange sourceRange_00;
  SourceRange SVar19;
  SourceRange SVar20;
  SourceRange range_01;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange range_02;
  HierarchicalReference hierRef;
  undefined1 in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd41;
  InvocationExpressionSyntax *local_2a8;
  SourceRange local_2a0;
  SourceLocation local_290;
  SourceLocation SStack_288;
  undefined1 local_280 [8];
  undefined1 local_278 [13];
  undefined3 uStack_26b;
  undefined1 auStack_268 [16];
  Scope *local_258;
  Symbol *local_250;
  undefined1 local_248 [192];
  Element *local_188;
  BumpAllocator *local_180;
  Type *local_178;
  Element local_170 [2];
  SmallVectorBase<slang::Diagnostic> local_130;
  
  SVar17 = sourceRange.endLoc;
  SVar20.startLoc = sourceRange.startLoc;
  this_00 = (AssertionInstanceExpression *)(comp->super_BumpAllocator).head;
  local_2a0.startLoc = (SourceLocation)result;
  local_2a0.endLoc = SVar20.startLoc;
  if (this_00 == (AssertionInstanceExpression *)0x0) {
    local_278._0_8_ = (Symbol *)0x0;
    pTVar10 = (Type *)this[8].constant;
    goto LAB_003977af;
  }
  parentContext = invocation;
  invocation_00 = SVar17;
  if ((((ulong)(withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode & 4) != 0) &&
     (bVar8 = Symbol::isType((Symbol *)this_00), bVar8)) {
    SVar20.endLoc = (SourceLocation)withClause;
    pTVar10 = Type::fromLookupResult((Type *)this,comp,result,SVar20,(ASTContext *)parentContext);
    pSVar11 = (Symbol *)
              BumpAllocator::
              emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange&>
                        ((BumpAllocator *)this,pTVar10,&local_2a0);
    bVar8 = bad((Expression *)pSVar11);
    if (bVar8) {
      return (Expression *)pSVar11;
    }
    if (invocation_00 == (SourceLocation)0x0) {
      if (invocation == (InvocationExpressionSyntax *)0x0) {
        return (Expression *)pSVar11;
      }
      SVar20 = parsing::Token::range((Token *)&invocation->attributes);
      ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0xa50007,SVar20);
    }
    else {
      SVar20.startLoc = local_2a0.startLoc;
      if (*(SourceLocation *)((long)invocation_00 + 0x58) != (SourceLocation)0x0) {
        SVar20.startLoc =
             parsing::Token::location
                       ((Token *)((long)*(SourceLocation *)((long)invocation_00 + 0x58) + 0x18));
      }
      pDVar12 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x570007,SVar20.startLoc);
      range.endLoc = local_2a0.endLoc;
      range.startLoc = local_2a0.startLoc;
      Diagnostic::operator<<(pDVar12,range);
    }
    pTVar10 = (Type *)this[8].constant;
    local_278._0_8_ = pSVar11;
    goto LAB_003977af;
  }
  EVar9 = (this_00->super_Expression).kind;
  local_2a8 = invocation;
  if (EVar9 == (Dist|StructuredAssignmentPattern)) {
    lVar18._0_4_ = (comp->options).maxConstexprDepth;
    lVar18._4_4_ = (comp->options).maxConstexprSteps;
    if (((((lVar18 == 0) && (((ulong)this_00[3].super_Expression.syntax & 0x200000000) != 0)) &&
         (SVar1 = (this_00->super_Expression).sourceRange.startLoc, SVar1 != (SourceLocation)0x0))
        && ((invocation_00 != (SourceLocation)0x0 ||
            ((((ulong)(withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode & 0x100) !=
              0 && (((ulong)this->constant & 0x200) != 0)))))) &&
       (pAVar2 = *(AssertionInstanceExpression **)((long)SVar1 + 8),
       (pAVar2->super_Expression).kind == 0x40)) {
      if (*(AssertionInstanceExpression **)&pAVar2[2].super_Expression == this_00) {
        this_00 = pAVar2;
      }
      EVar9 = (this_00->super_Expression).kind;
      goto LAB_003972c3;
    }
LAB_003974ba:
    bVar8 = false;
    if ((((ulong)(withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode & 0x100000) != 0)
       && (lVar4._0_4_ = (comp->options).maxConstexprDepth,
          lVar4._4_4_ = (comp->options).maxConstexprSteps, lVar4 != 0)) {
      lVar18 = *(long *)&(comp->options).maxCheckerInstanceDepth;
      if (lVar18 == 0) {
        bVar8 = false;
      }
      else {
        bVar8 = *(char *)(lVar18 + 0x28) == '\x01';
      }
    }
    HierarchicalReference::fromLookup
              ((HierarchicalReference *)local_278,(Compilation *)this,(LookupResult *)comp);
    SVar17 = (SourceLocation)0x0;
LAB_0039750f:
    sourceRange_01.endLoc = SVar17;
    sourceRange_01.startLoc = SVar20.startLoc;
    pSVar11 = (Symbol *)
              ValueExpressionBase::fromSymbol
                        ((ValueExpressionBase *)withClause,(ASTContext *)this_00,(Symbol *)local_278
                         ,(HierarchicalReference *)result,sourceRange_01,bVar8,
                         (bool)in_stack_fffffffffffffd40);
  }
  else {
LAB_003972c3:
    if ((int)EVar9 < 0x4f) {
      if (EVar9 != 0x40) {
        if (EVar9 != 0x48) goto LAB_003974ba;
        lVar6._0_4_ = (comp->options).maxConstexprDepth;
        lVar6._4_4_ = (comp->options).maxConstexprSteps;
        SVar17._1_7_ = 0;
        SVar17._0_1_ = lVar6 != 0;
        HierarchicalReference::fromLookup
                  ((HierarchicalReference *)local_278,(Compilation *)this,(LookupResult *)comp);
        bVar8 = false;
        goto LAB_0039750f;
      }
      SVar17 = invocation_00;
      if (invocation_00 != (SourceLocation)0x0) {
        SVar19 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)invocation_00);
        SVar20.startLoc = SVar19.endLoc;
        result = (LookupResult *)SVar19.startLoc;
      }
      local_248[0] = 0;
      in_stack_fffffffffffffd40 = SVar20.startLoc._0_1_;
      in_stack_fffffffffffffd41 = SVar20.startLoc._1_7_;
      SVar19.endLoc._0_1_ = in_stack_fffffffffffffd40;
      SVar19.startLoc = (SourceLocation)result;
      SVar19.endLoc._1_7_ = in_stack_fffffffffffffd41;
      local_290 = (SourceLocation)result;
      SStack_288 = SVar20.startLoc;
      local_278._0_8_ = this_00;
      pSVar11 = (Symbol *)
                CallExpression::fromLookup
                          ((CallExpression *)this,(Compilation *)local_278,(Subroutine *)0x0,
                           (Expression *)invocation_00,invocation,withClause,SVar19,
                           (ASTContext *)SVar17);
      invocation_00 = (SourceLocation)0x0;
      local_2a8 = (InvocationExpressionSyntax *)0x0;
    }
    else {
      if (1 < EVar9 - 0x4f) {
        if (EVar9 == 0x51) {
          range_02.endLoc = (SourceLocation)withClause;
          range_02.startLoc = SVar20.startLoc;
          pSVar11 = (Symbol *)
                    AssertionInstanceExpression::bindPort
                              (this_00,(Symbol *)result,range_02,(ASTContext *)SVar17);
          goto LAB_00397517;
        }
        if (EVar9 != 0x55) goto LAB_003974ba;
      }
      lVar3._0_4_ = (comp->options).maxConstexprDepth;
      lVar3._4_4_ = (comp->options).maxConstexprSteps;
      SVar17 = (SourceLocation)0x0;
      if (lVar3 == 0) {
        SVar17 = invocation_00;
        invocation_00 = (SourceLocation)0x0;
      }
      range_00.endLoc = (SourceLocation)withClause;
      range_00.startLoc = SVar20.startLoc;
      pSVar11 = (Symbol *)
                AssertionInstanceExpression::fromLookup
                          (this_00,(Symbol *)SVar17,(InvocationExpressionSyntax *)result,range_00,
                           (ASTContext *)parentContext);
      if (((this_00->super_Expression).kind == 0x55) &&
         (((comp->options).maxInstanceDepth & 2) != 0)) {
        if (SVar17 != (SourceLocation)0x0) {
          SVar19 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar17);
          SVar20.startLoc = SVar19.endLoc;
          result = (LookupResult *)SVar19.startLoc;
        }
        sourceRange_02.endLoc = SVar20.startLoc;
        sourceRange_02.startLoc = (SourceLocation)result;
        ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x690007,sourceRange_02);
      }
    }
  }
LAB_00397517:
  lVar5._0_4_ = (comp->options).maxConstexprDepth;
  lVar5._4_4_ = (comp->options).maxConstexprSteps;
  if (lVar5 != 0) {
    lVar18 = 0;
    uVar16 = 0;
    do {
      lVar6 = *(long *)&(comp->options).maxCheckerInstanceDepth;
      selector = (MemberSelector *)(lVar6 + lVar18);
      if ((lVar6 == 0) || (*(char *)(lVar6 + 0x28 + lVar18) != '\x01')) {
        ppEVar14 = std::
                   get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                             ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                               *)selector);
        pSVar11 = (Symbol *)
                  bindSelector((Compilation *)this,(Expression *)pSVar11,*ppEVar14,
                               (ASTContext *)withClause);
      }
      else {
        pTVar10 = (Type *)(pSVar11->name)._M_len;
        pTVar13 = pTVar10->canonical;
        if (pTVar13 == (Type *)0x0) {
          Type::resolveCanonical(pTVar10);
          pTVar13 = pTVar10->canonical;
        }
        if ((pTVar13->super_Symbol).kind == VirtualInterfaceType) {
          local_278._0_8_ = (Symbol *)0x0;
          local_278._8_5_ = 0;
          uStack_26b = 0;
          auStack_268._0_5_ = 0;
          local_258 = (Scope *)0x0;
          local_250 = (Symbol *)0x4;
          local_180 = (BumpAllocator *)0x0;
          local_178 = (Type *)0x2;
          local_130.data_ = (pointer)local_130.firstElement;
          local_130.len = 0;
          local_130.cap = 2;
          selectors._M_extent._M_extent_value = *(long *)&(comp->options).maxConstexprDepth - uVar16
          ;
          selectors._M_ptr = (pointer)(lVar18 + *(long *)&(comp->options).maxCheckerInstanceDepth);
          auStack_268._8_8_ = local_248;
          local_188 = local_170;
          Lookup::selectChild((Type *)(pSVar11->name)._M_len,*(SourceRange *)&pSVar11->parentScope,
                              selectors,(ASTContext *)withClause,(LookupResult *)local_278);
          LookupResult::reportDiags((LookupResult *)local_278,(ASTContext *)withClause);
          if ((Symbol *)local_278._0_8_ == (Symbol *)0x0) {
            comp_00 = (Compilation *)local_280;
            local_280 = (undefined1  [8])pSVar11;
            pIVar15 = BumpAllocator::
                      emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                                ((BumpAllocator *)this,(Expression **)comp_00,
                                 (Type *)this[8].constant);
          }
          else {
            comp_00 = (Compilation *)local_278;
            sourceRange_00.endLoc = invocation_00;
            sourceRange_00.startLoc = local_2a0.endLoc;
            pIVar15 = (InvalidExpression *)
                      bindLookupResult(this,comp_00,(LookupResult *)local_2a0.startLoc,
                                       sourceRange_00,local_2a8,withClause,
                                       (ASTContext *)
                                       CONCAT71(in_stack_fffffffffffffd41,in_stack_fffffffffffffd40)
                                      );
          }
          SmallVectorBase<slang::Diagnostic>::cleanup(&local_130,(EVP_PKEY_CTX *)comp_00);
          if (local_188 != local_170) {
            operator_delete(local_188);
          }
          if ((undefined1 *)auStack_268._8_8_ == local_248) {
            return &pIVar15->super_Expression;
          }
          operator_delete((void *)auStack_268._8_8_);
          return &pIVar15->super_Expression;
        }
        if (uVar16 == *(long *)&(comp->options).maxConstexprDepth - 1U) {
          pSVar11 = (Symbol *)
                    MemberAccessExpression::fromSelector
                              ((Compilation *)this,(Expression *)pSVar11,selector,
                               (InvocationExpressionSyntax *)invocation_00,
                               (ArrayOrRandomizeMethodExpressionSyntax *)local_2a8,
                               (ASTContext *)withClause,true);
          if (pSVar11->kind == Call) {
            invocation_00 = (SourceLocation)0x0;
            local_2a8 = (InvocationExpressionSyntax *)0x0;
          }
        }
        else {
          pSVar11 = (Symbol *)
                    MemberAccessExpression::fromSelector
                              ((Compilation *)this,(Expression *)pSVar11,selector,
                               (InvocationExpressionSyntax *)0x0,
                               (ArrayOrRandomizeMethodExpressionSyntax *)0x0,
                               (ASTContext *)withClause,true);
        }
      }
      uVar16 = uVar16 + 1;
      lVar18 = lVar18 + 0x30;
      uVar7._0_4_ = (comp->options).maxConstexprDepth;
      uVar7._4_4_ = (comp->options).maxConstexprSteps;
    } while (uVar16 < uVar7);
  }
  bVar8 = bad((Expression *)pSVar11);
  if (bVar8) {
    return (Expression *)pSVar11;
  }
  if (invocation_00 == (SourceLocation)0x0) {
    if (local_2a8 == (InvocationExpressionSyntax *)0x0) {
      return (Expression *)pSVar11;
    }
    SVar20 = parsing::Token::range((Token *)&local_2a8->attributes);
    ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0xa50007,SVar20);
  }
  else {
    SVar20.startLoc = local_2a0.startLoc;
    if (*(SourceLocation *)((long)invocation_00 + 0x58) != (SourceLocation)0x0) {
      SVar20.startLoc =
           parsing::Token::location
                     ((Token *)((long)*(SourceLocation *)((long)invocation_00 + 0x58) + 0x18));
    }
    SVar17 = local_2a0.startLoc;
    pDVar12 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x570007,SVar20.startLoc);
    range_01.endLoc = local_2a0.endLoc;
    range_01.startLoc = SVar17;
    Diagnostic::operator<<(pDVar12,range_01);
  }
  pTVar10 = (Type *)this[8].constant;
  local_278._0_8_ = pSVar11;
LAB_003977af:
  pIVar15 = BumpAllocator::
            emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                      ((BumpAllocator *)this,(Expression **)local_278,pTVar10);
  return &pIVar15->super_Expression;
}

Assistant:

Expression& Expression::bindLookupResult(Compilation& comp, LookupResult& result,
                                         SourceRange sourceRange,
                                         const InvocationExpressionSyntax* invocation,
                                         const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                         const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(comp, nullptr);

    auto errorIfInvoke = [&]() {
        // If we require a subroutine, enforce that now. The invocation syntax will have been
        // nulled out if we used it elsewhere in this function.
        if (invocation) {
            SourceLocation loc = invocation->arguments ? invocation->arguments->openParen.location()
                                                       : sourceRange.start();
            auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
            diag << sourceRange;
            return false;
        }
        else if (withClause) {
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
            return false;
        }
        return true;
    };

    if (context.flags.has(ASTFlags::AllowDataType) && symbol->isType()) {
        // We looked up a named data type and we were allowed to do so, so return it.
        const Type& resultType = Type::fromLookupResult(comp, result, sourceRange, context);
        auto expr = comp.emplace<DataTypeExpression>(resultType, sourceRange);
        if (!expr->bad() && !errorIfInvoke())
            return badExpr(comp, expr);

        return *expr;
    }

    // If we've found a function's return value variable and have parentheses for
    // a call expression, translate that symbol to be the subroutine itself to
    // allow for recursive function calls.
    if (symbol->kind == SymbolKind::Variable && result.selectors.empty() &&
        symbol->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {

        auto scope = symbol->getParentScope();
        if (scope && (invocation || (context.flags.has(ASTFlags::TopLevelStatement) &&
                                     comp.hasFlag(CompilationFlags::AllowRecursiveImplicitCall)))) {
            auto& sym = scope->asSymbol();
            if (sym.kind == SymbolKind::Subroutine &&
                sym.as<SubroutineSymbol>().returnValVar == symbol) {
                SLANG_ASSERT(sym.as<SubroutineSymbol>().subroutineKind == SubroutineKind::Function);
                symbol = &sym;
            }
        }
    }

    Expression* expr;
    switch (symbol->kind) {
        case SymbolKind::Subroutine: {
            SLANG_ASSERT(result.selectors.empty());
            SourceRange callRange = invocation ? invocation->sourceRange() : sourceRange;
            expr = &CallExpression::fromLookup(comp, &symbol->as<SubroutineSymbol>(), nullptr,
                                               invocation, withClause, callRange, context);
            invocation = nullptr;
            withClause = nullptr;
            break;
        }
        case SymbolKind::Sequence:
        case SymbolKind::Property:
        case SymbolKind::LetDecl: {
            const InvocationExpressionSyntax* localInvoke = nullptr;
            if (result.selectors.empty())
                localInvoke = std::exchange(invocation, nullptr);

            expr = &AssertionInstanceExpression::fromLookup(*symbol, localInvoke, sourceRange,
                                                            context);

            if (symbol->kind == SymbolKind::LetDecl &&
                result.flags.has(LookupResultFlags::IsHierarchical)) {
                SourceRange callRange = localInvoke ? localInvoke->sourceRange() : sourceRange;
                context.addDiag(diag::LetHierarchical, callRange);
            }
            break;
        }
        case SymbolKind::AssertionPort:
            expr = &AssertionInstanceExpression::bindPort(*symbol, sourceRange, context);
            break;
        case SymbolKind::ConstraintBlock: {
            // If there are selectors then this is ok -- either they will be valid because
            // they're accessing a built-in method or they will issue an error.
            const bool constraintAllowed = !result.selectors.empty();
            auto hierRef = HierarchicalReference::fromLookup(comp, result);
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, &hierRef, sourceRange,
                                                    constraintAllowed);
            break;
        }
        default: {
            const bool isDottedAccess =
                context.flags.has(ASTFlags::LValue) && !result.selectors.empty() &&
                std::get_if<LookupResult::MemberSelector>(&result.selectors[0]) != nullptr;

            auto hierRef = HierarchicalReference::fromLookup(comp, result);
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, &hierRef, sourceRange,
                                                    /* constraintAllowed */ false, isDottedAccess);
            break;
        }
    }

    // Drill down into member accesses.
    for (size_t i = 0; i < result.selectors.size(); i++) {
        auto& selector = result.selectors[i];
        auto memberSelect = std::get_if<LookupResult::MemberSelector>(&selector);
        if (memberSelect) {
            // If this is an access via a virtual interface we need to look at
            // all the selectors together, as this may constitute a hierarchical reference.
            if (expr->type->isVirtualInterface()) {
                LookupResult nextResult;
                std::span<LookupResult::Selector> selectors = result.selectors;
                Lookup::selectChild(*expr->type, expr->sourceRange, selectors.subspan(i), context,
                                    nextResult);

                nextResult.reportDiags(context);
                if (!nextResult.found)
                    return badExpr(comp, expr);

                return bindLookupResult(comp, nextResult, sourceRange, invocation, withClause,
                                        context);
            }

            if (i == result.selectors.size() - 1) {
                expr = &MemberAccessExpression::fromSelector(comp, *expr, *memberSelect, invocation,
                                                             withClause, context,
                                                             /* isFromLookupChain */ true);

                if (expr->kind == ExpressionKind::Call) {
                    invocation = nullptr;
                    withClause = nullptr;
                }
            }
            else {
                expr = &MemberAccessExpression::fromSelector(comp, *expr, *memberSelect, nullptr,
                                                             nullptr, context,
                                                             /* isFromLookupChain */ true);
            }
        }
        else {
            // Element / range selectors.
            auto selectSyntax = std::get<const ElementSelectSyntax*>(selector);
            expr = &bindSelector(comp, *expr, *selectSyntax, context);
        }
    }

    if (!expr->bad() && !errorIfInvoke())
        return badExpr(comp, expr);

    return *expr;
}